

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

istream * spvtools::utils::
          ParseNormalFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
                    (istream *is,bool negate_value,
                    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                    *value)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RAX;
  FloatProxy<float> FVar3;
  uint_type uVar4;
  uint uVar5;
  undefined4 uStack_28;
  FloatProxy<float> val;
  
  _uStack_28 = in_RAX;
  bVar2 = RejectParseDueToLeadingSign<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
                    (is,negate_value,value);
  if (!bVar2) {
    operator>>(is,&val);
    FVar3.data_ = val.data_;
    if (negate_value) {
      FVar3.data_ = val.data_ + 0x80000000;
      _uStack_28 = CONCAT44(FVar3.data_,uStack_28);
    }
    (value->value_).data_ = FVar3.data_;
    lVar1 = *(long *)is;
    uVar5 = FVar3.data_;
    if ((((byte)is[*(long *)(lVar1 + -0x18) + 0x20] & 5) != 0) && ((FVar3.data_ & 0x7fffffff) == 0))
    {
      (value->value_).data_ = 0;
      uVar5 = 0;
    }
    if ((FVar3.data_ & 0x7fffffff) == 0x7f800000) {
      uVar4 = (uint)(byte)~negate_value * -0x80000000 - 0x800001;
      if ((int)uVar5 < 0) {
        uVar4 = 0xff7fffff;
      }
      (value->value_).data_ = uVar4;
      std::ios::setstate((int)*(undefined8 *)(lVar1 + -0x18) + (int)is);
    }
  }
  return is;
}

Assistant:

inline std::istream& ParseNormalFloat(std::istream& is, bool negate_value,
                                      HexFloat<T, Traits>& value) {
  if (RejectParseDueToLeadingSign(is, negate_value, value)) {
    return is;
  }
  T val;
  is >> val;
  if (negate_value) {
    val = -val;
  }
  value.set_value(val);
  // In the failure case, map -0.0 to 0.0.
  if (is.fail() && value.getUnsignedBits() == 0u) {
    value = HexFloat<T, Traits>(typename HexFloat<T, Traits>::uint_type{0});
  }
  if (val.isInfinity()) {
    // Fail the parse.  Emulate standard behaviour by setting the value to
    // the closest normal value, and set the fail bit on the stream.
    value.set_value((value.isNegative() | negate_value) ? T::lowest()
                                                        : T::max());
    is.setstate(std::ios_base::failbit);
  }
  return is;
}